

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter.h
# Opt level: O0

void __thiscall
spdlog::details::z_formatter::format(z_formatter *this,log_msg *msg,tm *tm_time,memory_buffer *dest)

{
  char local_70 [11];
  bool is_negative;
  int local_5c;
  undefined1 local_58 [4];
  int total_minutes;
  scoped_pad p;
  size_t field_size;
  memory_buffer *dest_local;
  tm *tm_time_local;
  log_msg *msg_local;
  z_formatter *this_local;
  
  p.spaces_._M_str = (char *)0x6;
  scoped_pad::scoped_pad((scoped_pad *)local_58,6,&(this->super_flag_formatter).padinfo_,dest);
  local_5c = os::utc_minutes_offset(tm_time);
  local_70[3] = local_5c < 0;
  if ((bool)local_70[3]) {
    local_5c = -local_5c;
    local_70[2] = 0x2d;
    ::fmt::v5::internal::basic_buffer<char>::push_back((basic_buffer<char> *)dest,local_70 + 2);
  }
  else {
    local_70[1] = 0x2b;
    ::fmt::v5::internal::basic_buffer<char>::push_back((basic_buffer<char> *)dest,local_70 + 1);
  }
  fmt_helper::pad2<500ul>(local_5c / 0x3c,dest);
  local_70[0] = ':';
  ::fmt::v5::internal::basic_buffer<char>::push_back((basic_buffer<char> *)dest,local_70);
  fmt_helper::pad2<500ul>(local_5c % 0x3c,dest);
  scoped_pad::~scoped_pad((scoped_pad *)local_58);
  return;
}

Assistant:

void format(const details::log_msg &msg, const std::tm &tm_time, fmt::memory_buffer &dest) override
    {
        const size_t field_size = 6;
        scoped_pad p(field_size, padinfo_, dest);

#ifdef _WIN32
        int total_minutes = get_cached_offset(msg, tm_time);
#else
        // No need to chache under gcc,
        // it is very fast (already stored in tm.tm_gmtoff)
        (void)(msg);
        int total_minutes = os::utc_minutes_offset(tm_time);
#endif
        bool is_negative = total_minutes < 0;
        if (is_negative)
        {
            total_minutes = -total_minutes;
            dest.push_back('-');
        }
        else
        {
            dest.push_back('+');
        }

        fmt_helper::pad2(total_minutes / 60, dest); // hours
        dest.push_back(':');
        fmt_helper::pad2(total_minutes % 60, dest); // minutes
    }